

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

ON_MeshNgon *
ON_MeshNgon::NgonFromMeshFace(ON_MeshNgonBuffer *ngon_buffer,uint mesh_face_index,uint *fvi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  bool local_49;
  ON_MeshNgon *ngon;
  uint Vcount;
  uint local_fvi [4];
  uint *fvi_local;
  uint mesh_face_index_local;
  ON_MeshNgonBuffer *ngon_buffer_local;
  
  bVar5 = ON_IsNullPtr(ngon_buffer);
  if ((bVar5) || (fvi == (uint *)0x0)) {
    ngon_buffer_local = (ON_MeshNgonBuffer *)0x0;
  }
  else {
    uVar1 = *fvi;
    uVar2 = fvi[1];
    uVar3 = fvi[2];
    uVar4 = fvi[3];
    local_49 = uVar4 != 0xffffffff && uVar4 != uVar3;
    uVar6 = 3;
    if (local_49) {
      uVar6 = 4;
    }
    ngon_buffer->m_ngon_buffer[1] = (ON__UINT_PTR)(ngon_buffer->m_ngon_buffer + 3);
    ngon_buffer->m_ngon_buffer[2] = ngon_buffer->m_ngon_buffer[1] + (ulong)uVar6 * 4;
    *(uint *)ngon_buffer->m_ngon_buffer = uVar6;
    *(uint *)ngon_buffer->m_ngon_buffer[1] = uVar1;
    *(uint *)(ngon_buffer->m_ngon_buffer[1] + 4) = uVar2;
    *(uint *)(ngon_buffer->m_ngon_buffer[1] + 8) = uVar3;
    if ((int)ngon_buffer->m_ngon_buffer[0] == 4) {
      *(uint *)(ngon_buffer->m_ngon_buffer[1] + 0xc) = uVar4;
    }
    *(undefined4 *)((long)ngon_buffer->m_ngon_buffer + 4) = 1;
    *(uint *)ngon_buffer->m_ngon_buffer[2] = mesh_face_index;
    ngon_buffer_local = ngon_buffer;
  }
  return (ON_MeshNgon *)ngon_buffer_local;
}

Assistant:

class ON_MeshNgon* ON_MeshNgon::NgonFromMeshFace(
  class ON_MeshNgonBuffer& ngon_buffer,
  unsigned int mesh_face_index,
  const unsigned int* fvi
  )
{
  // The nullptr check is weird.
  // Speculation: There is / was some way that a null reference (like a * of a bona fide nullptr)
  // was in use?
  if ( ON_IsNullPtr(&ngon_buffer) || 0 == fvi )
    return 0;

  // local_fvi[] allows the fvi[] input to be stored in the buffer[] memory.
  unsigned int local_fvi[4] = {fvi[0],fvi[1],fvi[2],fvi[3]};
  fvi = local_fvi;

  unsigned int Vcount = (fvi[3] < ON_UNSET_UINT_INDEX && fvi[3] != fvi[2]) ? 4 : 3;

  ON_MeshNgon* ngon = (ON_MeshNgon*)(&ngon_buffer);
  ngon->m_vi = (unsigned int*)(ngon+1);
  ngon->m_fi = ngon->m_vi + Vcount;

  ngon->m_Vcount = Vcount;
  ngon->m_vi[0] = fvi[0];
  ngon->m_vi[1] = fvi[1];
  ngon->m_vi[2] = fvi[2];
  if ( 4 == ngon->m_Vcount )
    ngon->m_vi[3] = fvi[3];

  ngon->m_Fcount = 1;
  ngon->m_fi[0] = mesh_face_index;

  return ngon;
}